

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

int __thiscall
cmGeneratedFileStreamBase::CompressFile
          (cmGeneratedFileStreamBase *this,string *oldname,string *newname)

{
  int iVar1;
  char *path;
  gzFile file;
  FILE *__stream;
  size_t sVar2;
  undefined1 local_448 [8];
  char buffer [1024];
  size_t BUFFER_SIZE;
  size_t res;
  FILE *ifs;
  gzFile gf;
  string *newname_local;
  string *oldname_local;
  cmGeneratedFileStreamBase *this_local;
  
  path = (char *)std::__cxx11::string::c_str();
  file = cm_zlib_gzopen(path,"w");
  if (file != (gzFile)0x0) {
    __stream = (FILE *)cmsys::SystemTools::Fopen(oldname,"r");
    if (__stream == (FILE *)0x0) {
      cm_zlib_gzclose(file);
    }
    else {
      buffer[0x3f8] = '\0';
      buffer[0x3f9] = '\x04';
      buffer[0x3fa] = '\0';
      buffer[0x3fb] = '\0';
      buffer[0x3fc] = '\0';
      buffer[0x3fd] = '\0';
      buffer[0x3fe] = '\0';
      buffer[0x3ff] = '\0';
      do {
        sVar2 = fread(local_448,1,0x400,__stream);
        if (sVar2 == 0) {
          fclose(__stream);
          cm_zlib_gzclose(file);
          return 1;
        }
        iVar1 = cm_zlib_gzwrite(file,local_448,(uint)sVar2);
      } while (iVar1 != 0);
      fclose(__stream);
      cm_zlib_gzclose(file);
    }
  }
  return 0;
}

Assistant:

int cmGeneratedFileStreamBase::CompressFile(std::string const& oldname,
                                            std::string const& newname)
{
  gzFile gf = gzopen(newname.c_str(), "w");
  if (!gf) {
    return 0;
  }
  FILE* ifs = cmsys::SystemTools::Fopen(oldname, "r");
  if (!ifs) {
    gzclose(gf);
    return 0;
  }
  size_t res;
  const size_t BUFFER_SIZE = 1024;
  char buffer[BUFFER_SIZE];
  while ((res = fread(buffer, 1, BUFFER_SIZE, ifs)) > 0) {
    if (!gzwrite(gf, buffer, static_cast<int>(res))) {
      fclose(ifs);
      gzclose(gf);
      return 0;
    }
  }
  fclose(ifs);
  gzclose(gf);
  return 1;
}